

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

void __thiscall
google::protobuf::io::CodedOutputStream::WriteAliasedRaw
          (CodedOutputStream *this,void *data,int size)

{
  int iVar1;
  
  if (size < this->buffer_size_) {
    WriteRaw(this,data,size);
    return;
  }
  if (this->buffer_size_ < 1) {
    iVar1 = this->total_bytes_;
  }
  else {
    (*this->output_->_vptr_ZeroCopyOutputStream[3])();
    iVar1 = this->total_bytes_ - this->buffer_size_;
    this->buffer_size_ = 0;
    this->buffer_ = (uint8 *)0x0;
  }
  this->total_bytes_ = iVar1 + size;
  iVar1 = (*this->output_->_vptr_ZeroCopyOutputStream[5])(this->output_,data,(ulong)(uint)size);
  this->had_error_ = (bool)(this->had_error_ | (byte)iVar1 ^ 1);
  return;
}

Assistant:

void CodedOutputStream::WriteAliasedRaw(const void* data, int size) {
  if (size < buffer_size_
      ) {
    WriteRaw(data, size);
  } else {
    Trim();

    total_bytes_ += size;
    had_error_ |= !output_->WriteAliasedRaw(data, size);
  }
}